

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createShaderModuleTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  VkDevice device;
  VkAllocationCallbacks *deviceInterface;
  ProgramCollection<vk::ProgramBinary> *this;
  ProgramBinary *binary;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_a9;
  string local_a8;
  Move<vk::Handle<(vk::HandleType)14>_> local_88;
  RefData<vk::Handle<(vk::HandleType)14>_> local_68;
  undefined1 local_48 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shader;
  DeviceInterface *vk;
  VkDevice vkDevice;
  Context *context_local;
  
  device = Context::getDevice(context);
  deviceInterface = (VkAllocationCallbacks *)Context::getDeviceInterface(context);
  shader.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator = deviceInterface
  ;
  this = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"test",&local_a9);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this,&local_a8);
  ::vk::createShaderModule(&local_88,(DeviceInterface *)deviceInterface,device,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_68,(Move *)&local_88);
  data.deleter.m_deviceIface = local_68.deleter.m_deviceIface;
  data.object.m_internal = local_68.object.m_internal;
  data.deleter.m_device = local_68.deleter.m_device;
  data.deleter.m_allocator = local_68.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_48,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Creating shader module succeeded",&local_e1);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createShaderModuleTest (Context& context)
{
	const VkDevice					vkDevice	= context.getDevice();
	const DeviceInterface&			vk			= context.getDeviceInterface();
	const Unique<VkShaderModule>	shader		(createShaderModule(vk, vkDevice, context.getBinaryCollection().get("test"), 0));

	return tcu::TestStatus::pass("Creating shader module succeeded");
}